

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  FILE *__stream;
  Sound_Channels SVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  Sound_Channels _channels;
  Sound_Driver _driver;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  size_t sStack_b0;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  int stop;
  int iStack_60;
  int iStack_5c;
  socklen_t local_58;
  undefined4 uStack_54;
  sockaddr *psStack_50;
  char *local_48;
  addrinfo *paStack_40;
  
  local_80 = (char *)0x0;
  bVar9 = false;
  bVar8 = false;
  bVar10 = false;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  local_88 = (char *)0x0;
  SVar4 = SOUND_CHANNELS_STEREO;
  do {
    _channels = SVar4;
    iVar5 = getopt(argc,argv,"h:p:a:lHf:dc:D:");
    pcVar7 = _optarg;
    SVar4 = _channels;
    switch(iVar5) {
    case 0x61:
      iVar5 = strcmp(_optarg,"pulse");
      bVar8 = iVar5 == 0;
      iVar5 = strcmp(pcVar7,"alsa");
      bVar9 = iVar5 == 0;
      iVar5 = strcmp(pcVar7,"file");
      bVar10 = iVar5 == 0;
      bVar3 = true;
      break;
    case 0x62:
    case 0x65:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x6f:
switchD_00102716_caseD_62:
      fwrite("Usage: aisdecoder -h hostname -p port -a pulse,alsa,file [-f /path/file.raw] [-l]\n\n-h\tDestination host or IP address\n-p\tDestination UDP port\n-a\tAudio driver [pulse,alsa,file]\n-D\tALSA input device\n\tUse \'-D list\' to see all available system devices.\n-c\tSound channels [stereo,mono,left,right] (default stereo)\n-f\tFull path to 48kHz raw audio file\n-l\tLog sound levels to console (stderr)\n-d\tLog NMEA sentences to console (stderr)\n-H\tDisplay this help\n"
             ,0x1c0,1,_stderr);
      return 0;
    case 99:
      iVar5 = strcmp(_optarg,"mono");
      SVar4 = SOUND_CHANNELS_MONO;
      if (iVar5 != 0) {
        iVar5 = strcmp(pcVar7,"left");
        SVar4 = SOUND_CHANNELS_LEFT;
        if ((iVar5 != 0) && (iVar5 = strcmp(pcVar7,"right"), SVar4 = _channels, iVar5 == 0)) {
          SVar4 = SOUND_CHANNELS_RIGHT;
        }
      }
      break;
    case 100:
      debug_nmea = 1;
      break;
    case 0x66:
      local_80 = _optarg;
      break;
    case 0x68:
      local_78 = _optarg;
      bVar1 = true;
      break;
    case 0x6c:
      show_levels = '\x01';
      break;
    case 0x70:
      local_70 = _optarg;
      bVar2 = true;
      break;
    default:
      if (iVar5 != 0x44) {
        if (iVar5 == -1) {
          if (argc < 2) {
            pcVar7 = 
            "Usage: aisdecoder -h hostname -p port -a pulse,alsa,file [-f /path/file.raw] [-l]\n\n-h\tDestination host or IP address\n-p\tDestination UDP port\n-a\tAudio driver [pulse,alsa,file]\n-D\tALSA input device\n\tUse \'-D list\' to see all available system devices.\n-c\tSound channels [stereo,mono,left,right] (default stereo)\n-f\tFull path to 48kHz raw audio file\n-l\tLog sound levels to console (stderr)\n-d\tLog NMEA sentences to console (stderr)\n-H\tDisplay this help\n"
            ;
            sStack_b0 = 0x1c0;
          }
          else {
            if (bVar1) {
              if (bVar2) {
                if (bVar3) {
                  if (((bVar9) || (bVar8)) || (bVar10)) {
                    local_48 = (char *)0x0;
                    paStack_40 = (addrinfo *)0x0;
                    local_58 = 0;
                    uStack_54 = 0;
                    psStack_50 = (sockaddr *)0x0;
                    iStack_60 = 2;
                    iStack_5c = 0x11;
                    _stop = 0x20;
                    iVar5 = getaddrinfo(local_78,local_70,(addrinfo *)&stop,(addrinfo **)&addr);
                    if (iVar5 == 0) {
                      sock = socket(addr->ai_family,addr->ai_socktype,addr->ai_protocol);
                      __stream = _stderr;
                      if (sock == -1) {
                        piVar6 = __errno_location();
                        pcVar7 = strerror(*piVar6);
                        fputs(pcVar7,__stream);
                        return 1;
                      }
                      if (show_levels == '\x01') {
                        on_sound_level_changed = sound_level_changed;
                      }
                      on_nmea_sentence_received = nmea_sentence_received;
                      _driver = DRIVER_PULSE;
                      if (!bVar8) {
                        _driver = (uint)!bVar9 * 2;
                      }
                      iVar5 = initSoundDecoder(_channels,_driver,local_80,local_88);
                      _stop = _stop & 0xffffffff00000000;
                      if (iVar5 == 0) {
                        fprintf(_stderr,"%s\n",errorSoundDecoder);
                      }
                      else {
                        runSoundDecoder(&stop);
                      }
                      freeSoundDecoder();
                      freeaddrinfo((addrinfo *)addr);
                      return 0;
                    }
                    pcVar7 = "Failed to resolve remote socket address!\n";
                    sStack_b0 = 0x29;
                  }
                  else {
                    pcVar7 = "Invalid audio driver\n";
                    sStack_b0 = 0x15;
                  }
                }
                else {
                  pcVar7 = "Audio driver is not set\n";
                  sStack_b0 = 0x18;
                }
                goto LAB_00102a61;
              }
              pcVar7 = "Port is not set\n";
            }
            else {
              pcVar7 = "Host is not set\n";
            }
            sStack_b0 = 0x10;
          }
LAB_00102a61:
          fwrite(pcVar7,sStack_b0,1,_stderr);
          return 1;
        }
        goto switchD_00102716_caseD_62;
      }
      local_88 = _optarg;
      iVar5 = strcmp(_optarg,"list");
      if (iVar5 == 0) {
        printInDevices();
        return 0;
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    Sound_Channels channels = SOUND_CHANNELS_STEREO;
    char *host, *port, *file_name=NULL;
    const char *params=CMD_PARAMS;
    int alsa=0, pulse=0, file=0, winmm=0;
    int hfnd=0, pfnd=0, afnd=0;
#ifdef WIN32
    unsigned int deviceId=WAVE_MAPPER;
#endif
#ifdef HAVE_ALSA
    char *alsaDevice=NULL;
#endif
    int opt;
    while ((opt = getopt(argc, argv, params)) != -1) {
        switch (opt) {
        case 'h':
            host = optarg;
            hfnd = 1;
            break;
        case 'p':
            port = optarg;
            pfnd = 1;
            break;
        case 'a':
        #ifdef HAVE_PULSEAUDIO
            pulse = strcmp(optarg, "pulse") == 0;
        #endif
        #ifdef HAVE_ALSA
            alsa = strcmp(optarg, "alsa") == 0;
        #endif
        #ifdef WIN32
            winmm = strcmp(optarg, "winmm") == 0;
        #endif
            file = strcmp(optarg, "file") == 0;
            afnd = 1;
            break;
        case 'c':
            if (!strcmp(optarg, "mono")) channels = SOUND_CHANNELS_MONO;
            else if (!strcmp(optarg, "left")) channels = SOUND_CHANNELS_LEFT;
            else if (!strcmp(optarg, "right")) channels = SOUND_CHANNELS_RIGHT;
            break;
        case 'l':
            show_levels = 1;
            break;
        case 'f':
            file_name = optarg;
            break;
        case 'd':
            debug_nmea = 1;
            break;
#ifdef WIN32
        case 'D':
            if (!strcmp(optarg, "list")) {
                printInDevices();
                return EXIT_SUCCESS;
            } else {
                deviceId = atoi(optarg);
            }
            break;
#endif
#ifdef HAVE_ALSA
        case 'D':
            if (!strcmp(optarg, "list")) {
                printInDevices();
                return EXIT_SUCCESS;
            } else {
                alsaDevice = optarg;
            }
            break;
#endif
        case 'H':
        default:
            fprintf(stderr, HELP_MSG);
            return EXIT_SUCCESS;
            break;
        }
    }

    if (argc < 2) {
        fprintf(stderr, HELP_MSG);
        return EXIT_FAILURE;
    }

    if (!hfnd) {
        fprintf(stderr, "Host is not set\n");
        return EXIT_FAILURE;
    }

    if (!pfnd) {
        fprintf(stderr, "Port is not set\n");
        return EXIT_FAILURE;
    }

    if (!afnd) {
        fprintf(stderr, "Audio driver is not set\n");
        return EXIT_FAILURE;
    }

    if (!alsa && !pulse && !winmm && !file) {
        fprintf(stderr, "Invalid audio driver\n");
        return EXIT_FAILURE;
    }

    if (!initSocket(host, port)) {
        return EXIT_FAILURE;
    }
    if (show_levels) on_sound_level_changed=sound_level_changed;
    on_nmea_sentence_received=nmea_sentence_received;
    Sound_Driver driver = DRIVER_FILE;
#ifdef HAVE_ALSA
    if (alsa) driver = DRIVER_ALSA;
#endif
#ifdef HAVE_PULSEAUDIO
    if (pulse) driver = DRIVER_PULSE;
#endif
    int OK=0;
#ifdef WIN32
    if (!file) driver = DRIVER_WINMM;
    OK=initSoundDecoder(channels, driver, file_name, deviceId);
#else
#ifdef HAVE_ALSA
    OK=initSoundDecoder(channels, driver, file_name, alsaDevice);
#else
    OK=initSoundDecoder(channels, driver, file_name);
#endif
#endif
    int stop=0;
    if (OK) {
        runSoundDecoder(&stop);
    } else {
        fprintf(stderr, "%s\n", errorSoundDecoder);
    }
    freeSoundDecoder();
    freeaddrinfo(addr);
#ifdef WIN32
    WSACleanup();
#endif
    return 0;
}